

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O3

void __thiscall
QtPromisePrivate::PromiseError::PromiseError<QString>(PromiseError *this,QString *value)

{
  Data *pDVar1;
  void *__tmp;
  long *plVar2;
  
  (this->m_data)._M_exception_object = (void *)0x0;
  plVar2 = (long *)__cxa_allocate_exception(0x18);
  pDVar1 = (value->d).d;
  *plVar2 = (long)pDVar1;
  plVar2[1] = (long)(value->d).ptr;
  plVar2[2] = (value->d).size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  __cxa_throw(plVar2,&QString::typeinfo,QString::~QString);
}

Assistant:

PromiseError(const T& value)
    {
        try {
            throw value;
        } catch (...) {
            m_data = std::current_exception();
        }
    }